

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O0

void __thiscall
LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::~LinkedListPool
          (LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *this)

{
  bool bVar1;
  reference ppTVar2;
  __normal_iterator<depspawn::internal::TaskPool::Task_*const_*,_std::vector<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>_>
  *in_RDI;
  const_iterator it;
  const_iterator itend;
  vector<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<depspawn::internal::TaskPool::Task_*const_*,_std::vector<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>_>
  in_stack_ffffffffffffffe0;
  
  std::
  vector<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>
  ::end(in_stack_ffffffffffffffc8);
  __gnu_cxx::
  __normal_iterator<depspawn::internal::TaskPool::Task*const*,std::vector<depspawn::internal::TaskPool::Task*,std::allocator<depspawn::internal::TaskPool::Task*>>>
  ::__normal_iterator<depspawn::internal::TaskPool::Task**>
            (in_RDI,(__normal_iterator<depspawn::internal::TaskPool::Task_**,_std::vector<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>_>
                     *)in_stack_ffffffffffffffc8);
  std::
  vector<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>
  ::begin(in_stack_ffffffffffffffc8);
  __gnu_cxx::
  __normal_iterator<depspawn::internal::TaskPool::Task*const*,std::vector<depspawn::internal::TaskPool::Task*,std::allocator<depspawn::internal::TaskPool::Task*>>>
  ::__normal_iterator<depspawn::internal::TaskPool::Task**>
            (in_RDI,(__normal_iterator<depspawn::internal::TaskPool::Task_**,_std::vector<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>_>
                     *)in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<depspawn::internal::TaskPool::Task_*const_*,_std::vector<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<depspawn::internal::TaskPool::Task_*const_*,_std::vector<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>_>
              ::operator*((__normal_iterator<depspawn::internal::TaskPool::Task_*const_*,_std::vector<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>_>
                           *)&stack0xffffffffffffffe0);
    PoolAllocator_malloc_free<false>::free(*ppTVar2);
    __gnu_cxx::
    __normal_iterator<depspawn::internal::TaskPool::Task_*const_*,_std::vector<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>_>
    ::operator++((__normal_iterator<depspawn::internal::TaskPool::Task_*const_*,_std::vector<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>_>
                  *)&stack0xffffffffffffffe0);
  }
  std::
  vector<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>
  ::~vector((vector<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>
             *)in_stack_ffffffffffffffe0._M_current);
  return;
}

Assistant:

~LinkedListPool()
  {
    typename vector_t::const_iterator const itend = v_.end();
    for(typename vector_t::const_iterator it = v_.begin(); it != itend; ++it)
      PoolAllocator_malloc_free<SCALABLE>::free(reinterpret_cast<char*>(*it));
  }